

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O0

Col_Word Col_NewStringBuffer(size_t capacity,Col_StringFormat format)

{
  size_t sVar1;
  size_t max;
  size_t size;
  Col_Word strbuf;
  size_t sStack_18;
  Col_StringFormat format_local;
  size_t capacity_local;
  
  if ((format & 0x10) == 0) {
    if (capacity == 0) {
      max = 5;
    }
    else {
      sVar1 = Col_MaxStringBufferLength(format);
      sStack_18 = capacity;
      if (sVar1 < capacity) {
        sStack_18 = sVar1;
      }
      max = sStack_18 * (format & (COL_UCS4|COL_UCS2|COL_UCS1)) + 0x37 >> 5;
      if (0xffff < max) {
        max = 0xffff;
      }
    }
    capacity_local = (size_t)AllocCells(max);
    (*(Cell *)capacity_local)[0] = 'r';
    (*(Cell *)capacity_local)[1] = (char)format;
    *(short *)(*(Cell *)capacity_local + 2) = (short)max;
    *(char *)(capacity_local + 8) = '\f';
    *(char *)(capacity_local + 9) = '\0';
    *(char *)(capacity_local + 10) = '\0';
    *(char *)(capacity_local + 0xb) = '\0';
    *(char *)(capacity_local + 0xc) = '\0';
    *(char *)(capacity_local + 0xd) = '\0';
    *(char *)(capacity_local + 0xe) = '\0';
    *(char *)(capacity_local + 0xf) = '\0';
    *(char *)(capacity_local + 0x10) = '\0';
    *(char *)(capacity_local + 0x11) = '\0';
    *(char *)(capacity_local + 0x12) = '\0';
    *(char *)(capacity_local + 0x13) = '\0';
    *(char *)(capacity_local + 0x14) = '\0';
    *(char *)(capacity_local + 0x15) = '\0';
    *(char *)(capacity_local + 0x16) = '\0';
    *(char *)(capacity_local + 0x17) = '\0';
  }
  else {
    Col_Error(COL_VALUECHECK,ColibriDomain,0x26,(ulong)format);
    capacity_local = 0;
  }
  return capacity_local;
}

Assistant:

Col_Word
Col_NewStringBuffer(
    size_t capacity,            /*!< Maximum length of string buffer. If zero,
                                     use a default value. */
    Col_StringFormat format)    /*!< String format. */
{
    Col_Word strbuf;            /* Resulting word in the general case. */
    size_t size;                /* Number of allocated cells storing a minimum
                                 * of **capacity** elements. */

    /*
     * Check preconditions.
     */
    
    /*! @valuecheck{COL_ERROR_STRBUF_FORMAT,format} */
    VALUECHECK_STRBUF_FORMAT(format) return WORD_NIL;

    /*
     * Create a new string buffer word.
     */

    if (capacity == 0) {
        size = STRBUF_DEFAULT_SIZE;
    } else {
        size_t max = Col_MaxStringBufferLength(format);
        if (capacity > max) capacity = max;
        size = STRBUF_SIZE(capacity * CHAR_WIDTH(format));
        if (size > STRBUF_MAX_SIZE) size = STRBUF_MAX_SIZE;
    }
    strbuf = (Col_Word) AllocCells(size);
    WORD_STRBUF_INIT(strbuf, size, format);

    return strbuf;
}